

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.h
# Opt level: O1

ResizeBilinearLayerParams * __thiscall
CoreML::Specification::NeuralNetworkLayer::mutable_resizebilinear(NeuralNetworkLayer *this)

{
  ResizeBilinearLayerParams *this_00;
  
  if (this->_oneof_case_[0] != 0xd3) {
    clear_layer(this);
    this->_oneof_case_[0] = 0xd3;
    this_00 = (ResizeBilinearLayerParams *)operator_new(0x38);
    ResizeBilinearLayerParams::ResizeBilinearLayerParams(this_00);
    (this->layer_).resizebilinear_ = this_00;
  }
  return (ResizeBilinearLayerParams *)(this->layer_).convolution_;
}

Assistant:

inline ::CoreML::Specification::ResizeBilinearLayerParams* NeuralNetworkLayer::mutable_resizebilinear() {
  if (!has_resizebilinear()) {
    clear_layer();
    set_has_resizebilinear();
    layer_.resizebilinear_ = new ::CoreML::Specification::ResizeBilinearLayerParams;
  }
  // @@protoc_insertion_point(field_mutable:CoreML.Specification.NeuralNetworkLayer.resizeBilinear)
  return layer_.resizebilinear_;
}